

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createCoordinatesTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  ulong uVar2;
  TestNode *node;
  ostream *poVar3;
  int iVar4;
  undefined **ppuVar5;
  char *pcVar6;
  allocator<char> local_1f1;
  ulong local_1f0;
  ulong local_1e8;
  TestContext *local_1e0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string local_1c8;
  string local_1a8 [11];
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  local_1e0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"tesscoord","Tessellation coordinates tests");
  uVar2 = 0;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  while (pTVar1 = group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr, (int)uVar2 != 3) {
    ppuVar5 = &PTR_anon_var_dwarf_fe2586_00c085e8;
    local_1f0 = uVar2;
    local_1e8 = uVar2;
    for (iVar4 = 0;
        pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr, iVar4 != 3; iVar4 = iVar4 + 1) {
      node = (TestNode *)operator_new(0x78);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if ((uint)local_1f0 < 3) {
        pcVar6 = *(char **)(&DAT_00c085d0 + local_1e8 * 8);
      }
      else {
        pcVar6 = (char *)0x0;
      }
      poVar3 = std::operator<<((ostream *)local_1a8,pcVar6);
      poVar3 = std::operator<<(poVar3,"_");
      std::operator<<(poVar3,*ppuVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"",&local_1f1);
      TestCase::TestCase((TestCase *)node,local_1e0,&local_1c8,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c08540;
      *(int *)&node[1]._vptr_TestNode = (int)local_1f0;
      *(int *)((long)&node[1]._vptr_TestNode + 4) = iVar4;
      tcu::TestNode::addChild(&pTVar1->super_TestNode,node);
      ppuVar5 = ppuVar5 + 1;
    }
    uVar2 = (ulong)((int)local_1f0 + 1);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createCoordinatesTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "tesscoord", "Tessellation coordinates tests"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
		group->addChild(new TessCoordTest(testCtx, (TessPrimitiveType)primitiveTypeNdx, (SpacingMode)spacingModeNdx));

	return group.release();
}